

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  TcParseTableBase *pTVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TcParseTableBase *field;
  MessageLite *pMVar10;
  ulong uVar11;
  char *pcVar12;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  int iVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int iVar15;
  long v1_00;
  TcParseTableBase *ptr_00;
  uint *puVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  LogMessageFatal local_88;
  uint64_t local_78;
  MessageLite *local_70;
  TcParseTableBase *local_68;
  ushort uVar19;
  undefined2 uVar20;
  TcParseTableBase *table_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  field = (TcParseTableBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  uVar19 = *(ushort *)ptr;
  pTVar5 = *(TcParseTableBase **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  uVar20 = 0;
  aVar13._0_4_ = (int)(char)uVar19 + (uint)uVar19 >> 1;
  aVar13.data._4_4_ = 0;
  local_78 = hasbits;
  local_70 = msg;
  local_68 = table;
  uVar9 = aVar13._0_4_;
  table_00 = pTVar5;
  do {
    ptr_00 = field;
    pMVar10 = AddMessage(table_00,(RepeatedPtrFieldBase *)field);
    auVar17._8_8_ = extraout_RDX;
    auVar17._0_8_ = local_88.super_LogMessage._0_8_;
    iVar14 = ctx->depth_;
    v1 = (long)iVar14 + -1;
    iVar7 = (int)v1;
    ctx->depth_ = iVar7;
    if ((long)iVar14 < 1) goto LAB_0020fca2;
    local_88.super_LogMessage._0_8_ = &((TcParseTableBase *)ptr)->extension_offset;
    iVar4 = ctx->group_depth_;
    v1_00 = (long)iVar4 + 1;
    iVar15 = (int)v1_00;
    ctx->group_depth_ = iVar15;
    while( true ) {
      bVar6 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
      auVar17._8_8_ = extraout_RDX_00;
      auVar17._0_8_ = local_88.super_LogMessage._0_8_;
      if (bVar6) break;
      uVar8 = (uint)(byte)*(int *)&pTVar5->fast_idx_mask &
              (uint)*(ushort *)local_88.super_LogMessage._0_8_;
      if ((uVar8 & 7) != 0) goto LAB_0020fdad;
      uVar11 = (ulong)(uVar8 & 0xfffffff8);
      aVar13.data = (ulong)*(ushort *)local_88.super_LogMessage._0_8_ ^
                    *(ulong *)((long)&pTVar5[1].fast_idx_mask + uVar11 * 2);
      auVar17 = (**(code **)(&pTVar5[1].has_bits_offset + uVar11))
                          (pMVar10,local_88.super_LogMessage._0_8_,ctx,aVar13.data,pTVar5,0);
      local_88.super_LogMessage._0_8_ = auVar17._0_8_;
      if (((TcParseTableBase *)local_88.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_88.super_LogMessage._0_8_ = auVar17._0_8_;
    if ((pTVar5->field_0x9 & 1) == 0) {
      ptr = (char *)local_88.super_LogMessage._0_8_;
      if ((TcParseTableBase *)local_88.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) {
        ptr_00 = pTVar5;
        VerifyHasBitConsistency((MessageLite *)CONCAT44(uVar9,CONCAT22(uVar20,uVar19)),table_00);
        auVar18._8_8_ = extraout_RDX_01;
        auVar18._0_8_ = local_88.super_LogMessage._0_8_;
        goto LAB_0020fc75;
      }
    }
    else {
      ptr_00 = (TcParseTableBase *)local_88.super_LogMessage._0_8_;
      auVar18 = (undefined1  [16])
                (*pTVar5->post_loop_handler)(pMVar10,(char *)local_88.super_LogMessage._0_8_,ctx);
LAB_0020fc75:
      auVar17._8_8_ = auVar18._8_8_;
      auVar17._0_8_ = local_88.super_LogMessage._0_8_;
      ptr = (char *)auVar18._0_8_;
      if (auVar18._0_8_ == (TcParseTableBase *)0x0) {
        uVar1 = ctx->depth_;
        uVar2 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar2 + -1;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        goto LAB_0020fca2;
      }
    }
    local_88.super_LogMessage._0_8_ = auVar17._0_8_;
    if (iVar7 != ctx->depth_) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (v1,(long)ctx->depth_,"old_depth == depth_");
      iVar14 = 0x491;
LAB_0020fd46:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,iVar14,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_88);
    }
    ptr_00 = (TcParseTableBase *)(long)ctx->group_depth_;
    if (iVar15 != ctx->group_depth_) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
      iVar14 = 0x492;
      goto LAB_0020fd46;
    }
    ctx->group_depth_ = iVar4;
    ctx->depth_ = iVar14;
    uVar8 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    if (uVar8 != uVar9) {
LAB_0020fca2:
      local_88.super_LogMessage._0_8_ = auVar17._0_8_;
      pcVar12 = Error(local_70,(char *)ptr_00,auVar17._8_8_,(TcFieldData)aVar13,local_68,local_78);
      return pcVar12;
    }
    if ((TcParseTableBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)local_68->has_bits_offset != 0) {
        puVar16 = (uint *)((long)&local_70->_vptr_MessageLite + (ulong)local_68->has_bits_offset);
        if (((ulong)puVar16 & 3) != 0) {
          AlignFail();
        }
        *puVar16 = *puVar16 | (uint)local_78;
      }
      return (char *)(TcParseTableBase *)ptr;
    }
    uVar3 = ((TcParseTableBase *)ptr)->has_bits_offset;
    aVar13.data._2_6_ = 0;
    aVar13.data._0_2_ = uVar3;
    if (uVar3 != uVar19) {
      uVar9 = (uint)local_68->fast_idx_mask & (uint)uVar3;
      if ((uVar9 & 7) == 0) {
        uVar11 = (ulong)(uVar9 & 0xfffffff8);
        pcVar12 = (char *)(**(code **)(&local_68[1].has_bits_offset + uVar11))
                                    (local_70,ptr,ctx,
                                     aVar13.data ^
                                     *(ulong *)(&local_68[1].fast_idx_mask + uVar11 * 2),local_68,
                                     local_78);
        return pcVar12;
      }
LAB_0020fdad:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}